

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

void __thiscall glu::sl::ShaderParser::assumeToken(ShaderParser *this,Token token)

{
  long *plVar1;
  undefined8 extraout_RAX;
  Archive *pAVar2;
  long *plVar3;
  size_type *psVar4;
  ShaderParser *this_00;
  allocator<char> local_f1;
  undefined1 local_f0 [104];
  _Alloc_hider local_88;
  size_type local_80;
  undefined1 auStack_78 [24];
  long local_60 [2];
  string local_50;
  
  if (this->m_curToken == token) {
    return;
  }
  auStack_78._8_8_ = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(auStack_78 + 8),"unexpected token \'","");
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)(auStack_78 + 8),(ulong)(this->m_curTokenStr)._M_dataplus._M_p
                             );
  local_f0._0_8_ = *plVar1;
  pAVar2 = (Archive *)(plVar1 + 2);
  if ((Archive *)local_f0._0_8_ == pAVar2) {
    local_f0._16_8_ = pAVar2->_vptr_Archive;
    local_f0._24_8_ = plVar1[3];
    local_f0._0_8_ = (Archive *)(local_f0 + 0x10);
  }
  else {
    local_f0._16_8_ = pAVar2->_vptr_Archive;
  }
  local_f0._8_8_ = plVar1[1];
  this_00 = (ShaderParser *)local_f0;
  *plVar1 = (long)pAVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)this_00);
  local_f0._32_8_ = *plVar1;
  plVar3 = plVar1 + 2;
  if ((long *)local_f0._32_8_ == plVar3) {
    local_f0._48_8_ = *plVar3;
    local_f0._56_8_ = plVar1[3];
    local_f0._32_8_ = local_f0 + 0x30;
  }
  else {
    local_f0._48_8_ = *plVar3;
  }
  local_f0._40_8_ = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  getTokenName(this_00,token);
  plVar1 = (long *)std::__cxx11::string::append(local_f0 + 0x20);
  local_f0._64_8_ = *plVar1;
  plVar3 = plVar1 + 2;
  if ((long *)local_f0._64_8_ == plVar3) {
    local_f0._80_8_ = *plVar3;
    local_f0._88_8_ = plVar1[3];
    local_f0._64_8_ = local_f0 + 0x50;
  }
  else {
    local_f0._80_8_ = *plVar3;
  }
  local_f0._72_8_ = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append(local_f0 + 0x40);
  local_f0._96_8_ = *plVar1;
  psVar4 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_f0._96_8_ == psVar4) {
    local_80 = *psVar4;
    auStack_78._0_8_ = plVar1[3];
    local_f0._96_8_ = &local_80;
  }
  else {
    local_80 = *psVar4;
  }
  local_88._M_p = (pointer)plVar1[1];
  *plVar1 = (long)psVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,(char *)local_f0._96_8_,&local_f1);
  parseError(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((size_type *)local_f0._96_8_ != &local_80) {
    operator_delete((void *)local_f0._96_8_,local_80 + 1);
  }
  if ((undefined1 *)local_f0._64_8_ != local_f0 + 0x50) {
    operator_delete((void *)local_f0._64_8_,(ulong)(local_f0._80_8_ + 1));
  }
  if ((undefined1 *)local_f0._32_8_ != local_f0 + 0x30) {
    operator_delete((void *)local_f0._32_8_,(ulong)((long)(_func_int ***)local_f0._48_8_ + 1));
  }
  if ((Archive *)local_f0._0_8_ != (Archive *)(local_f0 + 0x10)) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  if ((long *)auStack_78._8_8_ != local_60) {
    operator_delete((void *)auStack_78._8_8_,local_60[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::assumeToken (Token token)
{
	if (m_curToken != token)
		parseError((string("unexpected token '") + m_curTokenStr + "', expecting '" + getTokenName(token) + "'").c_str());
	DE_TEST_ASSERT(m_curToken == token);
}